

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O3

int __thiscall AC3StreamReader::readPacketTHD(AC3StreamReader *this,AVPacket *avPacket)

{
  int iVar1;
  uint8_t *__src;
  int iVar2;
  CodecInfo *pCVar3;
  ostream *poVar4;
  pointer puVar5;
  long lVar6;
  long lVar7;
  size_t num;
  AVPacket *pAVar8;
  AVPacket *pAVar9;
  byte bVar10;
  string local_58;
  MemoryBlock *local_38;
  
  bVar10 = 0;
  if ((this->m_thdDemuxWaitAc3 == true) && ((this->m_delayedAc3Buffer).m_size != 0)) {
    pAVar8 = &this->m_delayedAc3Packet;
    pAVar9 = avPacket;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      pAVar9->pts = pAVar8->pts;
      pAVar8 = (AVPacket *)&pAVar8->dts;
      pAVar9 = (AVPacket *)&pAVar9->dts;
    }
    avPacket->codecID = (this->m_delayedAc3Packet).codecID;
    (this->m_delayedAc3Buffer).m_size = 0;
LAB_00175d7a:
    this->m_thdDemuxWaitAc3 = false;
    lVar7 = this->m_nextAc3Time;
    avPacket->pts = lVar7;
    avPacket->dts = lVar7;
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x40;
    this->m_nextAc3Time = lVar7 + (this->super_AC3Codec).m_frameDuration;
    iVar2 = 0;
  }
  else {
    iVar2 = SimplePacketizerReader::readPacket(&this->super_SimplePacketizerReader,avPacket);
    if (iVar2 == 0) {
      local_38 = &this->m_delayedAc3Buffer;
      do {
        if ((this->super_AC3Codec).m_state != stateDecodeTrueHDFirst) {
          lVar7 = this->m_totalTHDSamples;
          lVar6 = (lVar7 * 0x13b6d8300) / (long)(this->super_AC3Codec).mlp.m_samplerate;
          avPacket->pts = lVar6;
          avPacket->dts = lVar6;
          iVar2 = (this->super_AC3Codec).mlp.m_samples;
          this->m_totalTHDSamples = lVar7 + iVar2;
          iVar2 = this->m_demuxedTHDSamples + iVar2;
          this->m_demuxedTHDSamples = iVar2;
          iVar1 = (this->super_AC3Codec).m_samples;
          if (iVar2 < iVar1) {
            return 0;
          }
          this->m_demuxedTHDSamples = iVar2 - iVar1;
          this->m_thdDemuxWaitAc3 = true;
          return 0;
        }
        if (this->m_thdDemuxWaitAc3 == true) goto LAB_00175d7a;
        if ((this->m_delayedAc3Buffer).m_size != 0) {
          pCVar3 = AC3Codec::getCodecInfo(&this->super_AC3Codec);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(pCVar3->displayName)._M_dataplus._M_p,
                              (pCVar3->displayName)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," stream (track ",0xf);
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             (poVar4,(this->super_SimplePacketizerReader).super_AbstractStreamReader
                                     .m_streamIndex);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"): overlapped frame detected at position ",0x29);
          floatToTime_abi_cxx11_(&local_58,(double)avPacket->pts / 5292000000.0,',');
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_58._M_dataplus._M_p,local_58._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,". Remove frame.",0xf);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          sLastMsg = true;
        }
        pAVar8 = avPacket;
        pAVar9 = &this->m_delayedAc3Packet;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          pAVar9->pts = pAVar8->pts;
          pAVar8 = (AVPacket *)((long)pAVar8 + (ulong)bVar10 * -0x10 + 8);
          pAVar9 = (AVPacket *)((long)pAVar9 + (ulong)bVar10 * -0x10 + 8);
        }
        (this->m_delayedAc3Packet).codecID = avPacket->codecID;
        (this->m_delayedAc3Buffer).m_size = 0;
        num = (size_t)avPacket->size;
        if (num != 0) {
          __src = avPacket->data;
          MemoryBlock::grow(local_38,num);
          memcpy((this->m_delayedAc3Buffer).m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + ((this->m_delayedAc3Buffer).m_size - num),__src,
                 num);
        }
        puVar5 = (this->m_delayedAc3Buffer).m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar5 == (this->m_delayedAc3Buffer).m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          puVar5 = (pointer)0x0;
        }
        (this->m_delayedAc3Packet).data = puVar5;
        iVar2 = SimplePacketizerReader::readPacket(&this->super_SimplePacketizerReader,avPacket);
      } while (iVar2 == 0);
    }
  }
  return iVar2;
}

Assistant:

int AC3StreamReader::readPacketTHD(AVPacket& avPacket)
{
    if (m_thdDemuxWaitAc3 && !m_delayedAc3Buffer.isEmpty())
    {
        avPacket = m_delayedAc3Packet;
        m_delayedAc3Buffer.clear();
        m_thdDemuxWaitAc3 = false;
        avPacket.dts = avPacket.pts = m_nextAc3Time;
        avPacket.flags |= AVPacket::IS_CORE_PACKET;
        m_nextAc3Time += m_frameDuration;
        return 0;
    }

    while (true)
    {
        const int rez = SimplePacketizerReader::readPacket(avPacket);
        if (rez != 0)
            return rez;

        const bool isAc3Packet = (m_state == AC3State::stateDecodeTrueHDFirst);

        if (isAc3Packet)
        {
            if (m_thdDemuxWaitAc3)
            {
                m_thdDemuxWaitAc3 = false;
                avPacket.dts = avPacket.pts = m_nextAc3Time;
                avPacket.flags |= AVPacket::IS_CORE_PACKET;
                m_nextAc3Time += m_frameDuration;
                return 0;
            }
            if (!m_delayedAc3Buffer.isEmpty())
            {
                LTRACE(LT_INFO, 2,
                       getCodecInfo().displayName
                           << " stream (track " << m_streamIndex << "): overlapped frame detected at position "
                           << floatToTime((double)(avPacket.pts - PTS_CONST_OFFSET) / INTERNAL_PTS_FREQ, ',')
                           << ". Remove frame.");
            }

            m_delayedAc3Packet = avPacket;
            m_delayedAc3Buffer.clear();
            m_delayedAc3Buffer.append(avPacket.data, avPacket.size);
            m_delayedAc3Packet.data = m_delayedAc3Buffer.data();
        }
        else
        {
            // thg packet
            avPacket.dts = avPacket.pts = m_totalTHDSamples * INTERNAL_PTS_FREQ / mlp.m_samplerate;

            m_totalTHDSamples += mlp.m_samples;
            m_demuxedTHDSamples += mlp.m_samples;
            if (m_demuxedTHDSamples >= m_samples)
            {
                m_demuxedTHDSamples -= m_samples;
                m_thdDemuxWaitAc3 = true;
            }
            return 0;
        }
    }
}